

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturmchain.h
# Opt level: O0

int __thiscall gmath::SturmChain<double>::countSignChangesNegInf(SturmChain<double> *this)

{
  Polynomial<double> *this_00;
  long lVar1;
  int iVar2;
  uint uVar3;
  int *in_RDI;
  double f2;
  int k;
  int ret;
  double f1;
  double local_20;
  int local_18;
  int local_14;
  double local_10;
  
  local_14 = 0;
  this_00 = *(Polynomial<double> **)(in_RDI + 2);
  iVar2 = Polynomial<double>::getDegree(*(Polynomial<double> **)(in_RDI + 2));
  local_10 = Polynomial<double>::operator[](this_00,iVar2);
  uVar3 = Polynomial<double>::getDegree(*(Polynomial<double> **)(in_RDI + 2));
  if ((uVar3 & 1) != 0) {
    local_10 = local_10 * -1.0;
  }
  for (local_18 = 1; local_18 < *in_RDI; local_18 = local_18 + 1) {
    lVar1 = *(long *)(in_RDI + 2);
    iVar2 = Polynomial<double>::getDegree
                      ((Polynomial<double> *)(*(long *)(in_RDI + 2) + (long)local_18 * 0x10));
    local_20 = Polynomial<double>::operator[]
                         ((Polynomial<double> *)(lVar1 + (long)local_18 * 0x10),iVar2);
    uVar3 = Polynomial<double>::getDegree
                      ((Polynomial<double> *)(*(long *)(in_RDI + 2) + (long)local_18 * 0x10));
    if ((uVar3 & 1) != 0) {
      local_20 = local_20 * -1.0;
    }
    if (((local_10 < 0.0) && (0.0 <= local_20)) || ((0.0 <= local_10 && (local_20 < 0.0)))) {
      local_14 = local_14 + 1;
    }
    local_10 = local_20;
  }
  return local_14;
}

Assistant:

int countSignChangesNegInf() const
    {
      double f1;
      int    ret=0;

      // the sign of the highest coefficient, multiplied by -1 if the degree
      // is odd has the same sign as the limes at negative infinity

      f1=f[0][f[0].getDegree()];

      if ((f[0].getDegree() & 0x1) != 0)
      {
        f1*=-1;
      }

      for (int k=1; k<n; k++)
      {
        double f2=f[k][f[k].getDegree()];

        if ((f[k].getDegree() & 0x1) != 0)
        {
          f2*=-1;
        }

        if ((f1 < 0 && f2 >= 0) || (f1 >= 0 && f2 < 0))
        {
          ret++;
        }

        f1=f2;
      }

      return ret;
    }